

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  BBox1f BVar7;
  MemoryMonitorInterface *pMVar8;
  Split *pSVar9;
  vint *pvVar10;
  code *pcVar11;
  ThreadLocal2 *pTVar12;
  iterator iVar13;
  Instance *pIVar14;
  BBox1f *pBVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  BBox1f BVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  bool bVar39;
  Vec3fa VVar40;
  vint *pvVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  char cVar44;
  long lVar45;
  long lVar46;
  void *pvVar47;
  ulong uVar48;
  float *pfVar49;
  size_t sVar50;
  undefined8 *puVar51;
  runtime_error *prVar52;
  ulong *puVar53;
  char *pcVar54;
  ulong uVar55;
  ulong uVar56;
  BuildRecord *in_00;
  SetMB *this_00;
  ulong uVar57;
  ulong uVar58;
  BBox1f *pBVar59;
  mvector<PrimRefMB> *prims;
  uint *puVar60;
  bool bVar61;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar64;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  task_group_context *in_stack_ffffffffffffe1d8;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e18 [16];
  undefined1 local_1df8 [16];
  undefined1 local_1dd8 [16];
  undefined1 local_1dc8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  PrimInfoMB left;
  LBBox3fa lbbox_1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bf8;
  BBox1f local_1be8;
  char acStack_1be0 [8];
  ulong local_1bd8;
  ulong uStack_1bd0;
  size_t local_1bc8;
  size_t sStack_1bc0;
  size_t local_1bb8;
  size_t sStack_1bb0;
  BBox1f local_1ba8;
  BBox1f BStack_1ba0;
  BBox1f local_1b98;
  anon_class_1_0_00000001 reduction;
  undefined1 local_1b18 [16];
  undefined1 local_1b08 [16];
  undefined1 local_1af8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ad8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ac8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ab8;
  size_t local_1aa8;
  size_t sStack_1aa0;
  size_t local_1a98;
  size_t sStack_1a90;
  BBox1f local_1a88;
  float fStack_1a80;
  float fStack_1a7c;
  BBox1f local_1a78;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  ulong local_1848;
  ulong uStack_1840;
  size_t local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  BBox1f BStack_1820;
  BBox1f local_1818;
  undefined8 local_1808;
  uint uStack_17fc;
  undefined8 local_17f8;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 local_17d8 [8];
  undefined1 auStack_17d0 [8];
  LBBox3fa lbbox;
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778 [2];
  ulong local_1758 [2];
  size_t local_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar48 = in->depth;
  if ((this->cfg).maxDepth < uVar48) {
    puVar51 = (undefined8 *)__cxa_allocate_exception(0x30);
    lbbox.bounds0.lower.field_0._0_8_ = &lbbox.bounds0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lbbox,"depth limit reached","");
    *puVar51 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar51 + 1) = 1;
    puVar51[2] = puVar51 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar51 + 2),lbbox.bounds0.lower.field_0._0_8_,
               CONCAT71(lbbox.bounds0.lower.field_0._9_7_,lbbox.bounds0.lower.field_0._8_1_) +
               lbbox.bounds0.lower.field_0._0_8_);
    __cxa_throw(puVar51,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar16 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.lower.field_0;
  uVar17 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.lower.field_0 + 8);
  uVar18 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar19 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  uVar20 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.lower.field_0;
  uVar21 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.lower.field_0 + 8);
  uVar22 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uVar23 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  uVar24 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             lower.field_0;
  uVar25 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.lower.field_0 + 8);
  uVar26 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0;
  uVar27 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.upper.field_0 + 8);
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BVar7 = (BBox1f)(in->prims).prims;
  uVar58 = (in->prims).super_PrimInfoMB.object_range._begin;
  uVar55 = (in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&lbbox,this,&in->prims);
  local_1718[0].mapping.scale.field_0._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
  local_1718[0].mapping.ofs.field_0._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
  local_1718[0].mapping.num = lbbox.bounds0.upper.field_0._0_8_;
  uVar42 = lbbox.bounds0.lower.field_0._0_8_;
  local_18a8 = uVar16;
  uStack_18a0 = uVar17;
  local_1898 = uVar18;
  uStack_1890 = uVar19;
  local_1888 = uVar20;
  uStack_1880 = uVar21;
  local_1878 = uVar22;
  uStack_1870 = uVar23;
  local_1868 = uVar24;
  uStack_1860 = uVar25;
  local_1858 = uVar26;
  uStack_1850 = uVar27;
  local_1848 = uVar58;
  uStack_1840 = uVar55;
  local_1838 = values[0].ref.ptr;
  uStack_1830 = values[0]._8_8_;
  local_1828 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1820.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar34 = BStack_1820;
  local_1818 = BVar7;
  local_1808 = lbbox.bounds0.lower.field_0._0_8_;
  local_17f8 = lbbox.bounds0.upper.field_0._0_8_;
  local_17e8 = lbbox.bounds1.lower.field_0._0_8_;
  uStack_17e0 = lbbox.bounds1.lower.field_0._8_8_;
  local_17d8 = (undefined1  [8])lbbox.bounds1.upper.field_0._0_8_;
  auStack_17d0 = (undefined1  [8])lbbox.bounds1.upper.field_0._8_8_;
  if ((uVar48 == 1) && (uVar55 != uVar58)) {
    BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1820.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar45 = uVar55 - uVar58;
    if (uVar55 < uVar58 || lVar45 == 0) {
      fVar68 = INFINITY;
      fVar71 = -INFINITY;
    }
    else {
      pfVar49 = &(*(PrimRefMB **)((long)BVar7 + 0x20))[uVar58].time_range.upper;
      fVar71 = -INFINITY;
      fVar68 = INFINITY;
      do {
        if (((BBox1f *)(pfVar49 + -1))->lower <= fVar68) {
          fVar68 = ((BBox1f *)(pfVar49 + -1))->lower;
        }
        fVar70 = *pfVar49;
        if (*pfVar49 <= fVar71) {
          fVar70 = fVar71;
        }
        fVar71 = fVar70;
        pfVar49 = pfVar49 + 0x14;
        lVar45 = lVar45 + -1;
      } while (lVar45 != 0);
    }
    bVar28 = fVar71 < BStack_1820.upper || BStack_1820.lower < fVar68;
  }
  else {
    bVar28 = false;
  }
  uVar57 = uVar55 - uVar58;
  BStack_1820 = BVar34;
  if (((uVar57 <= (this->cfg).maxLeafSize) &&
      (uStack_17fc = (uint)((uint7)lbbox.bounds0.lower.field_0._9_7_ >> 0x18), uStack_17fc < 2)) &&
     (!bVar28)) {
    local_1b18._0_8_ = uVar57 * 0x10;
    pTVar12 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar12;
      MutexSys::lock(&pTVar12->mutex);
      if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
             ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar12->alloc0).bytesUsed = 0;
      (pTVar12->alloc0).bytesWasted = 0;
      (pTVar12->alloc0).end = 0;
      (pTVar12->alloc0).allocBlockSize = 0;
      (pTVar12->alloc0).ptr = (char *)0x0;
      (pTVar12->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar12->alloc1).bytesUsed = 0;
        (pTVar12->alloc1).bytesWasted = 0;
        (pTVar12->alloc1).end = 0;
        (pTVar12->alloc1).allocBlockSize = 0;
        (pTVar12->alloc1).ptr = (char *)0x0;
        (pTVar12->alloc1).cur = 0;
      }
      else {
        (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar12->alloc1).ptr = (char *)0x0;
        (pTVar12->alloc1).cur = 0;
        (pTVar12->alloc1).end = 0;
        (pTVar12->alloc1).allocBlockSize = 0;
        (pTVar12->alloc1).bytesUsed = 0;
        (pTVar12->alloc1).bytesWasted = 0;
        (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar12->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      lbbox.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox.bounds0.lower.field_0._8_1_ = 1;
      lbbox_1.bounds0.lower.field_0._0_8_ = pTVar12;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar13._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar13,(ThreadLocal2 **)&lbbox_1);
      }
      else {
        *iVar13._M_current = (ThreadLocal2 *)lbbox_1.bounds0.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (lbbox.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox.bounds0.lower.field_0._0_8_);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_1b18._0_8_;
    sVar50 = (alloc.talloc1)->cur;
    uVar48 = (ulong)(-(int)sVar50 & 0xf);
    uVar56 = sVar50 + local_1b18._0_8_ + uVar48;
    (alloc.talloc1)->cur = uVar56;
    if ((alloc.talloc1)->end < uVar56) {
      (alloc.talloc1)->cur = sVar50;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(local_1b18._0_8_ << 2)) {
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1b18);
      }
      else {
        lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
        (alloc.talloc1)->ptr = pcVar54;
        sVar50 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar50;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = local_1b18._0_8_;
        if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
          (alloc.talloc1)->cur = 0;
          lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
          (alloc.talloc1)->ptr = pcVar54;
          sVar50 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar50;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = local_1b18._0_8_;
          if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar54 = (char *)0x0;
            goto LAB_00d5bf10;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar50;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar48;
      pcVar54 = (alloc.talloc1)->ptr + (uVar56 - local_1b18._0_8_);
    }
LAB_00d5bf10:
    uVar48 = 7;
    if (uVar57 < 7) {
      uVar48 = uVar57;
    }
    aVar62 = _DAT_01feb9f0;
    aVar63 = _DAT_01feba00;
    aVar64 = _DAT_01feba00;
    aVar65 = _DAT_01feb9f0;
    if (uVar55 != uVar58) {
      puVar60 = (uint *)(pcVar54 + 8);
      lVar45 = uVar58 * 0x50 + 0xc;
      do {
        values[0].ref.ptr._0_4_ = BStack_1820.lower;
        values[0].ref.ptr._4_4_ = BStack_1820.upper;
        uVar6 = *(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).bounds0.lower
                                 .field_0 + lVar45);
        pIVar14 = (Instance *)(((this->createLeaf).bvh)->scene->geometries).items[uVar6].ptr;
        *(Instance **)(puVar60 + -2) = pIVar14;
        *puVar60 = uVar6;
        Instance::nonlinearBounds
                  (&lbbox,pIVar14,(BBox1f *)values,&(pIVar14->super_Geometry).time_range,
                   (pIVar14->super_Geometry).fnumTimeSegments);
        auVar35[8] = lbbox.bounds0.lower.field_0._8_1_;
        auVar35._0_8_ = lbbox.bounds0.lower.field_0._0_8_;
        auVar35._9_7_ = lbbox.bounds0.lower.field_0._9_7_;
        aVar65.m128 = (__m128)minps(aVar65.m128,auVar35);
        auVar36._8_8_ = lbbox.bounds0.upper.field_0._8_8_;
        auVar36._0_8_ = lbbox.bounds0.upper.field_0._0_8_;
        aVar64.m128 = (__m128)maxps(aVar64.m128,auVar36);
        auVar37._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
        auVar37._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
        aVar62.m128 = (__m128)minps(aVar62.m128,auVar37);
        auVar38._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
        auVar38._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
        aVar63.m128 = (__m128)maxps(aVar63.m128,auVar38);
        puVar60 = puVar60 + 4;
        lVar45 = lVar45 + 0x50;
        uVar57 = uVar57 - 1;
      } while (uVar57 != 0);
    }
    (__return_storage_ptr__->ref).ptr = uVar48 | (ulong)pcVar54 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar65;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar64;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar62;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar63;
    __return_storage_ptr__->dt = BStack_1820;
    return __return_storage_ptr__;
  }
  lVar45 = 0xbc;
  do {
    *(undefined8 *)(local_17d8 + lVar45 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(auStack_17d0 + lVar45 + 4) = 0;
    lVar45 = lVar45 + 0xf0;
  } while (lVar45 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  lbbox.bounds0.lower.field_0._0_8_ = uVar48;
  uVar43 = lbbox.bounds0.lower.field_0._0_8_;
  lbbox.bounds0.upper.field_0._0_8_ = uVar16;
  lbbox.bounds0.upper.field_0._8_8_ = uVar17;
  lbbox.bounds1.lower.field_0._0_8_ = uVar18;
  lbbox.bounds1.lower.field_0._8_8_ = uVar19;
  lbbox.bounds1.upper.field_0._0_8_ = uVar20;
  lbbox.bounds1.upper.field_0._8_8_ = uVar21;
  local_1788._0_8_ = uVar22;
  local_1788._8_8_ = uVar23;
  local_1778[0]._0_8_ = uVar24;
  local_1778[0]._8_8_ = uVar25;
  local_1778[1]._0_8_ = uVar26;
  local_1778[1]._8_8_ = uVar27;
  local_1758[0] = uVar58;
  local_1758[1] = uVar55;
  local_1748[0] = values[0].ref.ptr;
  local_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar7;
  lbbox.bounds0.lower.field_0._0_4_ = (undefined4)uVar42;
  lbbox.bounds0.lower.field_0._4_4_ = SUB84(uVar42,4);
  local_1718[0].sah = (float)lbbox.bounds0.lower.field_0._0_4_;
  local_1718[0].dim = lbbox.bounds0.lower.field_0._4_4_;
  local_840 = BVar7;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1dc8._8_8_ = 0x7f8000007f800000;
  local_1dc8._0_8_ = 0x7f8000007f800000;
  local_1dd8._8_8_ = 0xff800000ff800000;
  local_1dd8._0_8_ = 0xff800000ff800000;
  bVar39 = false;
  lbbox.bounds0.lower.field_0._0_8_ = uVar43;
  do {
    if (local_848 == 0) {
      uVar58 = 0xffffffffffffffff;
    }
    else {
      uVar58 = 0xffffffffffffffff;
      puVar53 = local_1758;
      uVar55 = 0;
      uVar57 = 0;
      do {
        uVar56 = puVar53[1] - *puVar53;
        if ((((this->cfg).maxLeafSize < uVar56) || (1 < *(uint *)((long)puVar53 + 0x4c))) ||
           (bVar28)) {
          if (uVar55 < uVar56) {
            uVar58 = uVar57;
            uVar55 = uVar56;
          }
          bVar28 = false;
        }
        uVar57 = uVar57 + 1;
        puVar53 = puVar53 + 0x1e;
      } while (local_848 != uVar57);
    }
    if (uVar58 != 0xffffffffffffffff) {
      lVar45 = uVar58 * 0xf0;
      lbbox_1.bounds0.lower.field_0._0_8_ = uVar48 + 1;
      local_1b18._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
      local_1a68 = 0xffffffff7f800000;
      uStack_1a60 = 0;
      pSVar3 = (Split *)((long)local_1718 + lVar45);
      iVar5 = *(int *)((long)local_1718 + lVar45 + 0xc);
      if (iVar5 == 0) {
        local_1bc8 = local_1758[uVar58 * 0x1e];
        sVar50 = local_1758[uVar58 * 0x1e + 1];
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        left.max_time_range.lower = 0.0;
        left.num_time_segments = 0;
        left.max_num_time_segments = 0;
        left.object_range._begin = 0;
        left.object_range._end = 0;
        left.max_time_range.upper = 1.0;
        left.time_range.lower = 1.0;
        left.time_range.upper = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar45 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar46 = (long)(1 << (*(byte *)((long)local_1718 + lVar45 + 4) & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar46);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar46 + 8);
        isLeft.split = pSVar3;
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        sStack_1bc0 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_1728[uVar58 * 0x1e] + 0x20),local_1bc8,
                                 sVar50,(EmptyTy *)local_19d8,&left,&right,&isLeft,&reduction,
                                 &reduction2,0x80,0xc00);
        local_1b98 = local_1728[uVar58 * 0x1e];
        BVar7 = local_1728[uVar58 * 0x1e + -1];
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        local_1bf8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        local_1bf8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1be8.lower =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _0_4_;
        local_1be8.upper =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _4_4_;
        acStack_1be0[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_1_;
        acStack_1be0[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._9_1_;
        acStack_1be0[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._10_1_;
        acStack_1be0[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._11_1_;
        acStack_1be0[4] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._12_1_;
        acStack_1be0[5] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._13_1_;
        acStack_1be0[6] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._14_1_;
        acStack_1be0[7] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._15_1_;
        local_1bd8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                     _0_8_;
        uStack_1bd0 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      _8_8_;
        local_1ba8.upper = left.max_time_range.upper;
        local_1ba8.lower = left.max_time_range.lower;
        local_1bb8 = left.num_time_segments;
        sStack_1bb0 = left.max_num_time_segments;
        fVar71 = BVar7.lower;
        BStack_1ba0.lower = fVar71;
        if (fVar71 <= left.time_range.lower) {
          BStack_1ba0.lower = left.time_range.lower;
        }
        fVar68 = BVar7.upper;
        BStack_1ba0.upper = left.time_range.upper;
        if (fVar68 <= left.time_range.upper) {
          BStack_1ba0.upper = fVar68;
        }
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1af8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        local_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1ae8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        local_1ae8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        local_1ad8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        local_1ad8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1ac8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
        local_1ac8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
        local_1ab8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
        local_1ab8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
        local_1a88.lower = right.max_time_range.lower;
        local_1a98 = right.num_time_segments;
        sStack_1a90 = right.max_num_time_segments;
        if (fVar71 <= right.time_range.lower) {
          BVar7.upper = 0.0;
          BVar7.lower = right.time_range.lower;
        }
        fStack_1a7c = right.time_range.upper;
        if (fVar68 <= right.time_range.upper) {
          fStack_1a7c = fVar68;
        }
        fStack_1a80 = BVar7.lower;
        local_1aa8 = sStack_1bc0;
        sStack_1aa0 = sVar50;
        local_1a78 = local_1b98;
LAB_00d5a664:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_00 = (SetMB *)((long)&lbbox + lVar45 + 0x10);
        if (iVar5 != 2) {
          if (iVar5 == 1) {
            SetMB::deterministic_order(this_00);
            splitFallback(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,(SetMB *)local_1b08);
          }
          else if (iVar5 == 3) {
            SetMB::deterministic_order(this_00);
            splitByGeometry(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,(SetMB *)local_1b08);
          }
          goto LAB_00d5a664;
        }
        time_range1.lower = *(float *)((long)local_1718 + lVar45 + 8);
        time_range0.lower = local_1728[uVar58 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar58 * 0x1e + -1].upper;
        BVar7 = local_1728[uVar58 * 0x1e];
        time_range0.upper = time_range1.lower;
        local_1b98 = (BBox1f)operator_new(0x28);
        pMVar8 = (this->heuristicTemporalSplit).device;
        uVar55 = local_1758[uVar58 * 0x1e + 1];
        *(MemoryMonitorInterface **)local_1b98 = pMVar8;
        *(undefined1 *)((long)local_1b98 + 8) = 0;
        *(long *)((long)local_1b98 + 0x10) = 0;
        *(long *)((long)local_1b98 + 0x18) = 0;
        *(long *)((long)local_1b98 + 0x20) = 0;
        lVar46 = uVar55 - local_1758[uVar58 * 0x1e];
        if (lVar46 != 0) {
          uVar55 = lVar46 * 0x50;
          (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar55,0);
          if (uVar55 < 0x1c00000) {
            pvVar47 = alignedMalloc(uVar55,0x10);
          }
          else {
            pvVar47 = os_malloc(uVar55,(bool *)((long)local_1b98 + 8));
          }
          *(void **)((long)local_1b98 + 0x20) = pvVar47;
          *(long *)((long)local_1b98 + 0x10) = lVar46;
          *(long *)((long)local_1b98 + 0x18) = lVar46;
        }
        pvVar41 = isLeft.vSplitPos;
        vSplitMask.field_0._0_4_ = BVar7.lower;
        vSplitMask.field_0._4_4_ = BVar7.upper;
        vSplitMask.field_0._8_8_ = &time_range0;
        pSVar9 = (Split *)local_1758[uVar58 * 0x1e];
        pvVar10 = (vint *)local_1758[uVar58 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_1b98;
        if ((ulong)((long)pvVar10 - (long)pSVar9) < 0xc00) {
          isLeft.split = pSVar9;
          isLeft.vSplitPos = pvVar10;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar41,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)pvVar10;
          vSplitPos.field_0.v[1] = (longlong)pSVar9;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,in_stack_ffffffffffffe1d8);
          cVar44 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar44 != '\0') {
            prVar52 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar52,"task cancelled");
            __cxa_throw(prVar52,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (left.object_range._end - left.object_range._begin !=
            local_1758[uVar58 * 0x1e + 1] - local_1758[uVar58 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          left.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                         (*(PrimRefMB **)((long)local_1b98 + 0x20),0,
                          local_1758[uVar58 * 0x1e + 1] - local_1758[uVar58 * 0x1e],0x400,
                          (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar16 = vSplitPos.field_0.v[1];
        local_1bb8 = left.num_time_segments;
        sStack_1bb0 = left.max_num_time_segments;
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        local_1bf8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        local_1bf8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1be8.lower =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _0_4_;
        local_1be8.upper =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _4_4_;
        acStack_1be0[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_1_;
        acStack_1be0[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._9_1_;
        acStack_1be0[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._10_1_;
        acStack_1be0[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._11_1_;
        acStack_1be0[4] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._12_1_;
        acStack_1be0[5] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._13_1_;
        acStack_1be0[6] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._14_1_;
        acStack_1be0[7] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._15_1_;
        local_1bd8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                     _0_8_;
        uStack_1bd0 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      _8_8_;
        local_1bc8 = left.object_range._begin;
        sStack_1bc0 = left.object_range._end;
        local_1ba8.upper = left.max_time_range.upper;
        local_1ba8.lower = left.max_time_range.lower;
        BStack_1ba0 = (BBox1f)(CONCAT44(~-(uint)(left.time_range.upper < time_range0.upper) &
                                        (uint)time_range0.upper,
                                        ~-(uint)(left.time_range.lower < time_range0.lower) &
                                        (uint)left.time_range.lower) |
                              CONCAT44((uint)left.time_range.upper &
                                       -(uint)(left.time_range.upper < time_range0.upper),
                                       (uint)time_range0.lower &
                                       -(uint)(left.time_range.lower < time_range0.lower)));
        pcVar11 = (code *)local_1758[uVar58 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        _reduction2 = BVar7;
        if ((long)pcVar11 - local_1758[uVar58 * 0x1e] < 0xc00) {
          vSplitPos.field_0.v[0] = local_1758[uVar58 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)pcVar11;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar16,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19d8._8_8_ = &reduction2;
          _reduction = pcVar11;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,in_stack_ffffffffffffe1d8);
          cVar44 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar44 != '\0') {
            prVar52 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar52,"task cancelled");
            __cxa_throw(prVar52,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar46 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = local_1758[uVar58 * 0x1e];
        right.object_range._end = lVar46 + right.object_range._begin;
        if (lVar46 != local_1758[uVar58 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar7 + 0x20),right.object_range._begin,
                          local_1758[uVar58 * 0x1e + 1],0x400,(anon_class_8_1_41ce32a6 *)&isLeft);
        }
        local_1ad8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        local_1ad8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1ac8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
        local_1ac8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
        local_1ab8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
        local_1ab8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
        local_1a98 = right.num_time_segments;
        sStack_1a90 = right.max_num_time_segments;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1af8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        local_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1ae8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        local_1ae8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        local_1aa8 = right.object_range._begin;
        sStack_1aa0 = right.object_range._end;
        local_1a88.upper = right.max_time_range.upper;
        local_1a88.lower = right.max_time_range.lower;
        fStack_1a80 = (float)(~-(uint)(right.time_range.lower < time_range1.lower) &
                              (uint)right.time_range.lower |
                             (uint)time_range1.lower &
                             -(uint)(right.time_range.lower < time_range1.lower));
        fStack_1a7c = (float)(~-(uint)(right.time_range.upper < time_range1.upper) &
                              (uint)time_range1.upper |
                             (uint)right.time_range.upper &
                             -(uint)(right.time_range.upper < time_range1.upper));
        local_1a78 = BVar7;
      }
      bVar61 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&left,this,(SetMB *)&lbbox_1.bounds0.upper);
      uVar16 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
               _0_8_;
      uVar17 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
               _8_8_;
      uVar18 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
               _0_8_;
      uVar19 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _0_8_;
      uVar20 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _8_8_;
      uVar21 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _0_8_;
      uVar22 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _8_8_;
      findFallback((Split *)&left,this,(SetMB *)local_1b08);
      lVar46 = local_640;
      local_1a68 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_;
      uStack_1a60 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._8_8_;
      local_1a58 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      local_1a48 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      uStack_1a40 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._8_8_;
      local_1a38 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                   field_0._0_8_;
      uStack_1a30 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar59 = local_8c8[uVar58];
      if (local_1b98 == *pBVar59) {
        pBVar59[1] = (BBox1f)((long)pBVar59[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar46 * 2 + -1] = local_1b98;
        local_838[lVar46 * 2].lower = 1.4013e-45;
        local_838[lVar46 * 2].upper = 0.0;
        local_8c8[uVar58] = local_838 + lVar46 * 2 + -1;
      }
      lVar46 = local_640;
      if (local_1a78 == *pBVar59) {
        local_8c8[local_848] = pBVar59;
        pBVar59[1] = (BBox1f)((long)pBVar59[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar46 * 2 + -1] = local_1a78;
        local_838[lVar46 * 2].lower = 1.4013e-45;
        local_838[lVar46 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar46 * 2 + -1;
      }
      pBVar15 = pBVar59 + 1;
      *pBVar15 = (BBox1f)((long)*pBVar15 + -1);
      if ((*pBVar15 == (BBox1f)0x0) && (BVar7 = *pBVar59, BVar7 != (BBox1f)0x0)) {
        lVar46 = *(undefined8 *)((long)BVar7 + 0x18);
        pvVar47 = *(void **)((long)BVar7 + 0x20);
        if (pvVar47 != (void *)0x0) {
          if ((ulong)(lVar46 * 0x50) < 0x1c00000) {
            alignedFree(pvVar47);
          }
          else {
            os_free(pvVar47,lVar46 * 0x50,*(bool *)((long)BVar7 + 8));
          }
        }
        if (lVar46 != 0) {
          (**(code **)**(undefined8 **)BVar7)(*(undefined8 **)BVar7,lVar46 * -0x50,1);
        }
        *(undefined8 *)((long)BVar7 + 0x10) = 0;
        *(undefined8 *)((long)BVar7 + 0x18) = 0;
        *(undefined8 *)((long)BVar7 + 0x20) = 0;
        operator_delete((void *)BVar7);
      }
      uVar55 = local_848;
      VVar40.field_0 =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      *(undefined8 *)((long)&lbbox + lVar45) = lbbox_1.bounds0.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x10) = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x18) = lbbox_1.bounds0.upper.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x20) = lbbox_1.bounds1.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x28) = lbbox_1.bounds1.lower.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x30) = lbbox_1.bounds1.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x38) = lbbox_1.bounds1.upper.field_0._8_8_;
      ((BBox1f *)(local_1788 + uVar58 * 0xf0))->lower = (float)local_1bf8._0_4_;
      ((BBox1f *)(local_1788 + uVar58 * 0xf0))->upper = local_1bf8.m128[1];
      ((BBox1f *)(local_1788 + uVar58 * 0xf0 + 8))->lower = (float)local_1bf8._8_4_;
      ((BBox1f *)(local_1788 + uVar58 * 0xf0 + 8))->upper = local_1bf8.m128[3];
      *(BBox1f *)(local_1778 + uVar58 * 0xf) = local_1be8;
      *(char (*) [8])((long)local_1778 + uVar58 * 0xf0 + 8) = acStack_1be0;
      local_1758[uVar58 * 0x1e + -2] = local_1bd8;
      local_1758[uVar58 * 0x1e + -1] = uStack_1bd0;
      local_1758[uVar58 * 0x1e] = local_1bc8;
      local_1758[uVar58 * 0x1e + 1] = sStack_1bc0;
      local_1748[uVar58 * 0x1e] = local_1bb8;
      local_1748[uVar58 * 0x1e + 1] = sStack_1bb0;
      (&local_1738)[uVar58 * 0x1e] = local_1ba8;
      local_1728[uVar58 * 0x1e + -1] = BStack_1ba0;
      *(BBox1f *)&local_1728[uVar58 * 0x1e].lower = local_1b98;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           (undefined4)uVar16;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           SUB84(uVar16,4);
      pSVar3->sah = (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0._0_4_;
      pSVar3->dim = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._4_4_;
      *(undefined8 *)((long)local_1718 + lVar45 + 8) = uVar17;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x10) = uVar18;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x20) = uVar19;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x28) = uVar20;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x30) = uVar21;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x38) = uVar22;
      lVar45 = local_848 * 0xf0;
      *(undefined8 *)((long)&lbbox + lVar45) = local_1b18._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x10) = local_1b08._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x18) = local_1b08._8_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x20) = local_1af8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x28) = local_1af8._8_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x30) = local_1ae8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar45 + 0x38) = local_1ae8._8_8_;
      *(undefined8 *)(local_1788 + uVar55 * 0xf0) = local_1ad8._0_8_;
      *(undefined8 *)(local_1788 + uVar55 * 0xf0 + 8) = local_1ad8._8_8_;
      *(undefined8 *)(local_1778 + uVar55 * 0xf) = local_1ac8._0_8_;
      *(undefined8 *)((long)local_1778 + uVar55 * 0xf0 + 8) = local_1ac8._8_8_;
      local_1758[uVar55 * 0x1e + -2] = local_1ab8._0_8_;
      local_1758[uVar55 * 0x1e + -1] = local_1ab8._8_8_;
      local_1758[uVar55 * 0x1e] = local_1aa8;
      local_1758[uVar55 * 0x1e + 1] = sStack_1aa0;
      local_1748[uVar55 * 0x1e] = local_1a98;
      local_1748[uVar55 * 0x1e + 1] = sStack_1a90;
      BVar34.upper = fStack_1a7c;
      BVar34.lower = fStack_1a80;
      (&local_1738)[uVar55 * 0x1e] = local_1a88;
      local_1728[uVar55 * 0x1e + -1] = BVar34;
      local_1728[uVar55 * 0x1e] = local_1a78;
      *(undefined8 *)((long)local_1718 + lVar45) = local_1a68;
      *(undefined8 *)((long)local_1718 + lVar45 + 8) = uStack_1a60;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x10) = local_1a58;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x20) = local_1a48;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x28) = uStack_1a40;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x30) = local_1a38;
      *(undefined8 *)((long)local_1718 + lVar45 + 0x38) = uStack_1a30;
      local_848 = local_848 + 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           VVar40.field_0;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar39 = (bool)(bVar39 | bVar61);
    }
  } while ((uVar58 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    pfVar49 = &fStack_172c;
    uVar48 = local_848;
    do {
      bVar39 = (bool)(bVar39 | ((in->prims).super_PrimInfoMB.time_range.lower < pfVar49[-1] ||
                               *pfVar49 < (in->prims).super_PrimInfoMB.time_range.upper));
      pfVar49 = pfVar49 + 0x3c;
      uVar48 = uVar48 - 1;
    } while (uVar48 != 0);
  }
  if (!bVar39) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar12 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
      local_1b18[8] = 1;
      local_1b18._0_8_ = pTVar12;
      MutexSys::lock(&pTVar12->mutex);
      if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
             ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar12->alloc0).bytesUsed = 0;
      (pTVar12->alloc0).bytesWasted = 0;
      (pTVar12->alloc0).end = 0;
      (pTVar12->alloc0).allocBlockSize = 0;
      (pTVar12->alloc0).ptr = (char *)0x0;
      (pTVar12->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar12->alloc1).bytesUsed = 0;
        (pTVar12->alloc1).bytesWasted = 0;
        (pTVar12->alloc1).end = 0;
        (pTVar12->alloc1).allocBlockSize = 0;
        (pTVar12->alloc1).ptr = (char *)0x0;
        (pTVar12->alloc1).cur = 0;
      }
      else {
        (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar12->alloc1).ptr = (char *)0x0;
        (pTVar12->alloc1).cur = 0;
        (pTVar12->alloc1).end = 0;
        (pTVar12->alloc1).allocBlockSize = 0;
        (pTVar12->alloc1).bytesUsed = 0;
        (pTVar12->alloc1).bytesWasted = 0;
        (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar12->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar12;
      lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox_1.bounds0.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar13._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar13,(ThreadLocal2 **)&left);
      }
      else {
        *iVar13._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
      }
      if (local_1b18[8] == '\x01') {
        MutexSys::unlock((MutexSys *)local_1b18._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar50 = (alloc.talloc0)->cur;
    uVar48 = (ulong)(-(int)sVar50 & 0xf);
    uVar58 = sVar50 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar48;
    (alloc.talloc0)->cur = uVar58;
    if ((alloc.talloc0)->end < uVar58) {
      (alloc.talloc0)->cur = sVar50;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar54;
        sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar50;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
          (alloc.talloc0)->ptr = pcVar54;
          sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar50;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar54 = (char *)0x0;
            goto LAB_00d5b7b6;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar50;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar48;
      pcVar54 = (alloc.talloc0)->ptr +
                (uVar58 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00d5b7b6:
    pcVar54[0x60] = '\0';
    pcVar54[0x61] = '\0';
    pcVar54[0x62] = -0x80;
    pcVar54[99] = '\x7f';
    pcVar54[100] = '\0';
    pcVar54[0x65] = '\0';
    pcVar54[0x66] = -0x80;
    pcVar54[0x67] = '\x7f';
    pcVar54[0x68] = '\0';
    pcVar54[0x69] = '\0';
    pcVar54[0x6a] = -0x80;
    pcVar54[0x6b] = '\x7f';
    pcVar54[0x6c] = '\0';
    pcVar54[0x6d] = '\0';
    pcVar54[0x6e] = -0x80;
    pcVar54[0x6f] = '\x7f';
    pcVar54[0x40] = '\0';
    pcVar54[0x41] = '\0';
    pcVar54[0x42] = -0x80;
    pcVar54[0x43] = '\x7f';
    pcVar54[0x44] = '\0';
    pcVar54[0x45] = '\0';
    pcVar54[0x46] = -0x80;
    pcVar54[0x47] = '\x7f';
    pcVar54[0x48] = '\0';
    pcVar54[0x49] = '\0';
    pcVar54[0x4a] = -0x80;
    pcVar54[0x4b] = '\x7f';
    pcVar54[0x4c] = '\0';
    pcVar54[0x4d] = '\0';
    pcVar54[0x4e] = -0x80;
    pcVar54[0x4f] = '\x7f';
    pcVar54[0x20] = '\0';
    pcVar54[0x21] = '\0';
    pcVar54[0x22] = -0x80;
    pcVar54[0x23] = '\x7f';
    pcVar54[0x24] = '\0';
    pcVar54[0x25] = '\0';
    pcVar54[0x26] = -0x80;
    pcVar54[0x27] = '\x7f';
    pcVar54[0x28] = '\0';
    pcVar54[0x29] = '\0';
    pcVar54[0x2a] = -0x80;
    pcVar54[0x2b] = '\x7f';
    pcVar54[0x2c] = '\0';
    pcVar54[0x2d] = '\0';
    pcVar54[0x2e] = -0x80;
    pcVar54[0x2f] = '\x7f';
    pcVar54[0x70] = '\0';
    pcVar54[0x71] = '\0';
    pcVar54[0x72] = -0x80;
    pcVar54[0x73] = -1;
    pcVar54[0x74] = '\0';
    pcVar54[0x75] = '\0';
    pcVar54[0x76] = -0x80;
    pcVar54[0x77] = -1;
    pcVar54[0x78] = '\0';
    pcVar54[0x79] = '\0';
    pcVar54[0x7a] = -0x80;
    pcVar54[0x7b] = -1;
    pcVar54[0x7c] = '\0';
    pcVar54[0x7d] = '\0';
    pcVar54[0x7e] = -0x80;
    pcVar54[0x7f] = -1;
    pcVar54[0x50] = '\0';
    pcVar54[0x51] = '\0';
    pcVar54[0x52] = -0x80;
    pcVar54[0x53] = -1;
    pcVar54[0x54] = '\0';
    pcVar54[0x55] = '\0';
    pcVar54[0x56] = -0x80;
    pcVar54[0x57] = -1;
    pcVar54[0x58] = '\0';
    pcVar54[0x59] = '\0';
    pcVar54[0x5a] = -0x80;
    pcVar54[0x5b] = -1;
    pcVar54[0x5c] = '\0';
    pcVar54[0x5d] = '\0';
    pcVar54[0x5e] = -0x80;
    pcVar54[0x5f] = -1;
    pcVar54[0x30] = '\0';
    pcVar54[0x31] = '\0';
    pcVar54[0x32] = -0x80;
    pcVar54[0x33] = -1;
    pcVar54[0x34] = '\0';
    pcVar54[0x35] = '\0';
    pcVar54[0x36] = -0x80;
    pcVar54[0x37] = -1;
    pcVar54[0x38] = '\0';
    pcVar54[0x39] = '\0';
    pcVar54[0x3a] = -0x80;
    pcVar54[0x3b] = -1;
    pcVar54[0x3c] = '\0';
    pcVar54[0x3d] = '\0';
    pcVar54[0x3e] = -0x80;
    pcVar54[0x3f] = -1;
    pcVar54[0x80] = '\0';
    pcVar54[0x81] = '\0';
    pcVar54[0x82] = '\0';
    pcVar54[0x83] = '\0';
    pcVar54[0x84] = '\0';
    pcVar54[0x85] = '\0';
    pcVar54[0x86] = '\0';
    pcVar54[0x87] = '\0';
    pcVar54[0x88] = '\0';
    pcVar54[0x89] = '\0';
    pcVar54[0x8a] = '\0';
    pcVar54[0x8b] = '\0';
    pcVar54[0x8c] = '\0';
    pcVar54[0x8d] = '\0';
    pcVar54[0x8e] = '\0';
    pcVar54[0x8f] = '\0';
    pcVar54[0x90] = '\0';
    pcVar54[0x91] = '\0';
    pcVar54[0x92] = '\0';
    pcVar54[0x93] = '\0';
    pcVar54[0x94] = '\0';
    pcVar54[0x95] = '\0';
    pcVar54[0x96] = '\0';
    pcVar54[0x97] = '\0';
    pcVar54[0x98] = '\0';
    pcVar54[0x99] = '\0';
    pcVar54[0x9a] = '\0';
    pcVar54[0x9b] = '\0';
    pcVar54[0x9c] = '\0';
    pcVar54[0x9d] = '\0';
    pcVar54[0x9e] = '\0';
    pcVar54[0x9f] = '\0';
    pcVar54[0xa0] = '\0';
    pcVar54[0xa1] = '\0';
    pcVar54[0xa2] = '\0';
    pcVar54[0xa3] = '\0';
    pcVar54[0xa4] = '\0';
    pcVar54[0xa5] = '\0';
    pcVar54[0xa6] = '\0';
    pcVar54[0xa7] = '\0';
    pcVar54[0xa8] = '\0';
    pcVar54[0xa9] = '\0';
    pcVar54[0xaa] = '\0';
    pcVar54[0xab] = '\0';
    pcVar54[0xac] = '\0';
    pcVar54[0xad] = '\0';
    pcVar54[0xae] = '\0';
    pcVar54[0xaf] = '\0';
    pcVar54[0xb0] = '\0';
    pcVar54[0xb1] = '\0';
    pcVar54[0xb2] = '\0';
    pcVar54[0xb3] = '\0';
    pcVar54[0xb4] = '\0';
    pcVar54[0xb5] = '\0';
    pcVar54[0xb6] = '\0';
    pcVar54[0xb7] = '\0';
    pcVar54[0xb8] = '\0';
    pcVar54[0xb9] = '\0';
    pcVar54[0xba] = '\0';
    pcVar54[0xbb] = '\0';
    pcVar54[0xbc] = '\0';
    pcVar54[0xbd] = '\0';
    pcVar54[0xbe] = '\0';
    pcVar54[0xbf] = '\0';
    pcVar54[0xc0] = '\0';
    pcVar54[0xc1] = '\0';
    pcVar54[0xc2] = '\0';
    pcVar54[0xc3] = '\0';
    pcVar54[0xc4] = '\0';
    pcVar54[0xc5] = '\0';
    pcVar54[0xc6] = '\0';
    pcVar54[199] = '\0';
    pcVar54[200] = '\0';
    pcVar54[0xc9] = '\0';
    pcVar54[0xca] = '\0';
    pcVar54[0xcb] = '\0';
    pcVar54[0xcc] = '\0';
    pcVar54[0xcd] = '\0';
    pcVar54[0xce] = '\0';
    pcVar54[0xcf] = '\0';
    pcVar54[0xd0] = '\0';
    pcVar54[0xd1] = '\0';
    pcVar54[0xd2] = '\0';
    pcVar54[0xd3] = '\0';
    pcVar54[0xd4] = '\0';
    pcVar54[0xd5] = '\0';
    pcVar54[0xd6] = '\0';
    pcVar54[0xd7] = '\0';
    pcVar54[0xd8] = '\0';
    pcVar54[0xd9] = '\0';
    pcVar54[0xda] = '\0';
    pcVar54[0xdb] = '\0';
    pcVar54[0xdc] = '\0';
    pcVar54[0xdd] = '\0';
    pcVar54[0xde] = '\0';
    pcVar54[0xdf] = '\0';
    lVar45 = 0;
    do {
      pcVar4 = pcVar54 + lVar45 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\b';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      lVar45 = lVar45 + 2;
    } while (lVar45 != 4);
    uVar48 = 1;
    goto LAB_00d5b825;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar12 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
    local_1b18[8] = 1;
    local_1b18._0_8_ = pTVar12;
    MutexSys::lock(&pTVar12->mutex);
    if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
           ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar12->alloc0).bytesUsed = 0;
    (pTVar12->alloc0).bytesWasted = 0;
    (pTVar12->alloc0).end = 0;
    (pTVar12->alloc0).allocBlockSize = 0;
    (pTVar12->alloc0).ptr = (char *)0x0;
    (pTVar12->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar12->alloc1).bytesUsed = 0;
      (pTVar12->alloc1).bytesWasted = 0;
      (pTVar12->alloc1).end = 0;
      (pTVar12->alloc1).allocBlockSize = 0;
      (pTVar12->alloc1).ptr = (char *)0x0;
      (pTVar12->alloc1).cur = 0;
    }
    else {
      (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar12->alloc1).ptr = (char *)0x0;
      (pTVar12->alloc1).cur = 0;
      (pTVar12->alloc1).end = 0;
      (pTVar12->alloc1).allocBlockSize = 0;
      (pTVar12->alloc1).bytesUsed = 0;
      (pTVar12->alloc1).bytesWasted = 0;
      (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar12->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar12;
    lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    lbbox_1.bounds0.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar13._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar13,(ThreadLocal2 **)&left);
    }
    else {
      *iVar13._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
    }
    if (local_1b18[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_1b18._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar50 = (alloc.talloc0)->cur;
  uVar48 = (ulong)(-(int)sVar50 & 0xf);
  uVar58 = sVar50 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar48;
  (alloc.talloc0)->cur = uVar58;
  if ((alloc.talloc0)->end < uVar58) {
    (alloc.talloc0)->cur = sVar50;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
      (alloc.talloc0)->ptr = pcVar54;
      sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar50;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar54;
        sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar50;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar54 = (char *)0x0;
          goto LAB_00d5b6bb;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar50;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar48;
    pcVar54 = (alloc.talloc0)->ptr +
              (uVar58 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00d5b6bb:
  pcVar54[0xe0] = '\0';
  pcVar54[0xe1] = '\0';
  pcVar54[0xe2] = -0x80;
  pcVar54[0xe3] = '\x7f';
  pcVar54[0xe4] = '\0';
  pcVar54[0xe5] = '\0';
  pcVar54[0xe6] = -0x80;
  pcVar54[0xe7] = '\x7f';
  pcVar54[0xe8] = '\0';
  pcVar54[0xe9] = '\0';
  pcVar54[0xea] = -0x80;
  pcVar54[0xeb] = '\x7f';
  pcVar54[0xec] = '\0';
  pcVar54[0xed] = '\0';
  pcVar54[0xee] = -0x80;
  pcVar54[0xef] = '\x7f';
  pcVar54[0xf0] = '\0';
  pcVar54[0xf1] = '\0';
  pcVar54[0xf2] = -0x80;
  pcVar54[0xf3] = -1;
  pcVar54[0xf4] = '\0';
  pcVar54[0xf5] = '\0';
  pcVar54[0xf6] = -0x80;
  pcVar54[0xf7] = -1;
  pcVar54[0xf8] = '\0';
  pcVar54[0xf9] = '\0';
  pcVar54[0xfa] = -0x80;
  pcVar54[0xfb] = -1;
  pcVar54[0xfc] = '\0';
  pcVar54[0xfd] = '\0';
  pcVar54[0xfe] = -0x80;
  pcVar54[0xff] = -1;
  pcVar54[0x60] = '\0';
  pcVar54[0x61] = '\0';
  pcVar54[0x62] = -0x80;
  pcVar54[99] = '\x7f';
  pcVar54[100] = '\0';
  pcVar54[0x65] = '\0';
  pcVar54[0x66] = -0x80;
  pcVar54[0x67] = '\x7f';
  pcVar54[0x68] = '\0';
  pcVar54[0x69] = '\0';
  pcVar54[0x6a] = -0x80;
  pcVar54[0x6b] = '\x7f';
  pcVar54[0x6c] = '\0';
  pcVar54[0x6d] = '\0';
  pcVar54[0x6e] = -0x80;
  pcVar54[0x6f] = '\x7f';
  pcVar54[0x40] = '\0';
  pcVar54[0x41] = '\0';
  pcVar54[0x42] = -0x80;
  pcVar54[0x43] = '\x7f';
  pcVar54[0x44] = '\0';
  pcVar54[0x45] = '\0';
  pcVar54[0x46] = -0x80;
  pcVar54[0x47] = '\x7f';
  pcVar54[0x48] = '\0';
  pcVar54[0x49] = '\0';
  pcVar54[0x4a] = -0x80;
  pcVar54[0x4b] = '\x7f';
  pcVar54[0x4c] = '\0';
  pcVar54[0x4d] = '\0';
  pcVar54[0x4e] = -0x80;
  pcVar54[0x4f] = '\x7f';
  pcVar54[0x20] = '\0';
  pcVar54[0x21] = '\0';
  pcVar54[0x22] = -0x80;
  pcVar54[0x23] = '\x7f';
  pcVar54[0x24] = '\0';
  pcVar54[0x25] = '\0';
  pcVar54[0x26] = -0x80;
  pcVar54[0x27] = '\x7f';
  pcVar54[0x28] = '\0';
  pcVar54[0x29] = '\0';
  pcVar54[0x2a] = -0x80;
  pcVar54[0x2b] = '\x7f';
  pcVar54[0x2c] = '\0';
  pcVar54[0x2d] = '\0';
  pcVar54[0x2e] = -0x80;
  pcVar54[0x2f] = '\x7f';
  pcVar54[0x70] = '\0';
  pcVar54[0x71] = '\0';
  pcVar54[0x72] = -0x80;
  pcVar54[0x73] = -1;
  pcVar54[0x74] = '\0';
  pcVar54[0x75] = '\0';
  pcVar54[0x76] = -0x80;
  pcVar54[0x77] = -1;
  pcVar54[0x78] = '\0';
  pcVar54[0x79] = '\0';
  pcVar54[0x7a] = -0x80;
  pcVar54[0x7b] = -1;
  pcVar54[0x7c] = '\0';
  pcVar54[0x7d] = '\0';
  pcVar54[0x7e] = -0x80;
  pcVar54[0x7f] = -1;
  pcVar54[0x50] = '\0';
  pcVar54[0x51] = '\0';
  pcVar54[0x52] = -0x80;
  pcVar54[0x53] = -1;
  pcVar54[0x54] = '\0';
  pcVar54[0x55] = '\0';
  pcVar54[0x56] = -0x80;
  pcVar54[0x57] = -1;
  pcVar54[0x58] = '\0';
  pcVar54[0x59] = '\0';
  pcVar54[0x5a] = -0x80;
  pcVar54[0x5b] = -1;
  pcVar54[0x5c] = '\0';
  pcVar54[0x5d] = '\0';
  pcVar54[0x5e] = -0x80;
  pcVar54[0x5f] = -1;
  pcVar54[0x30] = '\0';
  pcVar54[0x31] = '\0';
  pcVar54[0x32] = -0x80;
  pcVar54[0x33] = -1;
  pcVar54[0x34] = '\0';
  pcVar54[0x35] = '\0';
  pcVar54[0x36] = -0x80;
  pcVar54[0x37] = -1;
  pcVar54[0x38] = '\0';
  pcVar54[0x39] = '\0';
  pcVar54[0x3a] = -0x80;
  pcVar54[0x3b] = -1;
  pcVar54[0x3c] = '\0';
  pcVar54[0x3d] = '\0';
  pcVar54[0x3e] = -0x80;
  pcVar54[0x3f] = -1;
  pcVar54[0x80] = '\0';
  pcVar54[0x81] = '\0';
  pcVar54[0x82] = '\0';
  pcVar54[0x83] = '\0';
  pcVar54[0x84] = '\0';
  pcVar54[0x85] = '\0';
  pcVar54[0x86] = '\0';
  pcVar54[0x87] = '\0';
  pcVar54[0x88] = '\0';
  pcVar54[0x89] = '\0';
  pcVar54[0x8a] = '\0';
  pcVar54[0x8b] = '\0';
  pcVar54[0x8c] = '\0';
  pcVar54[0x8d] = '\0';
  pcVar54[0x8e] = '\0';
  pcVar54[0x8f] = '\0';
  pcVar54[0x90] = '\0';
  pcVar54[0x91] = '\0';
  pcVar54[0x92] = '\0';
  pcVar54[0x93] = '\0';
  pcVar54[0x94] = '\0';
  pcVar54[0x95] = '\0';
  pcVar54[0x96] = '\0';
  pcVar54[0x97] = '\0';
  pcVar54[0x98] = '\0';
  pcVar54[0x99] = '\0';
  pcVar54[0x9a] = '\0';
  pcVar54[0x9b] = '\0';
  pcVar54[0x9c] = '\0';
  pcVar54[0x9d] = '\0';
  pcVar54[0x9e] = '\0';
  pcVar54[0x9f] = '\0';
  pcVar54[0xa0] = '\0';
  pcVar54[0xa1] = '\0';
  pcVar54[0xa2] = '\0';
  pcVar54[0xa3] = '\0';
  pcVar54[0xa4] = '\0';
  pcVar54[0xa5] = '\0';
  pcVar54[0xa6] = '\0';
  pcVar54[0xa7] = '\0';
  pcVar54[0xa8] = '\0';
  pcVar54[0xa9] = '\0';
  pcVar54[0xaa] = '\0';
  pcVar54[0xab] = '\0';
  pcVar54[0xac] = '\0';
  pcVar54[0xad] = '\0';
  pcVar54[0xae] = '\0';
  pcVar54[0xaf] = '\0';
  pcVar54[0xb0] = '\0';
  pcVar54[0xb1] = '\0';
  pcVar54[0xb2] = '\0';
  pcVar54[0xb3] = '\0';
  pcVar54[0xb4] = '\0';
  pcVar54[0xb5] = '\0';
  pcVar54[0xb6] = '\0';
  pcVar54[0xb7] = '\0';
  pcVar54[0xb8] = '\0';
  pcVar54[0xb9] = '\0';
  pcVar54[0xba] = '\0';
  pcVar54[0xbb] = '\0';
  pcVar54[0xbc] = '\0';
  pcVar54[0xbd] = '\0';
  pcVar54[0xbe] = '\0';
  pcVar54[0xbf] = '\0';
  pcVar54[0xc0] = '\0';
  pcVar54[0xc1] = '\0';
  pcVar54[0xc2] = '\0';
  pcVar54[0xc3] = '\0';
  pcVar54[0xc4] = '\0';
  pcVar54[0xc5] = '\0';
  pcVar54[0xc6] = '\0';
  pcVar54[199] = '\0';
  pcVar54[200] = '\0';
  pcVar54[0xc9] = '\0';
  pcVar54[0xca] = '\0';
  pcVar54[0xcb] = '\0';
  pcVar54[0xcc] = '\0';
  pcVar54[0xcd] = '\0';
  pcVar54[0xce] = '\0';
  pcVar54[0xcf] = '\0';
  pcVar54[0xd0] = '\0';
  pcVar54[0xd1] = '\0';
  pcVar54[0xd2] = '\0';
  pcVar54[0xd3] = '\0';
  pcVar54[0xd4] = '\0';
  pcVar54[0xd5] = '\0';
  pcVar54[0xd6] = '\0';
  pcVar54[0xd7] = '\0';
  pcVar54[0xd8] = '\0';
  pcVar54[0xd9] = '\0';
  pcVar54[0xda] = '\0';
  pcVar54[0xdb] = '\0';
  pcVar54[0xdc] = '\0';
  pcVar54[0xdd] = '\0';
  pcVar54[0xde] = '\0';
  pcVar54[0xdf] = '\0';
  lVar45 = 0;
  do {
    pcVar4 = pcVar54 + lVar45 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\b';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    lVar45 = lVar45 + 2;
  } while (lVar45 != 4);
  uVar48 = 6;
LAB_00d5b825:
  local_1e18._8_8_ = 0xff800000ff800000;
  local_1e18._0_8_ = 0xff800000ff800000;
  local_1df8._8_8_ = 0x7f8000007f800000;
  local_1df8._0_8_ = 0x7f8000007f800000;
  in_00 = (BuildRecord *)&lbbox;
  if (local_848 != 0) {
    pBVar59 = &values[0].dt;
    uVar58 = 0;
    local_1df8._8_8_ = 0x7f8000007f800000;
    local_1df8._0_8_ = 0x7f8000007f800000;
    local_1dc8._8_8_ = 0x7f8000007f800000;
    local_1dc8._0_8_ = 0x7f8000007f800000;
    local_1e18._8_8_ = 0xff800000ff800000;
    local_1e18._0_8_ = 0xff800000ff800000;
    local_1dd8._8_8_ = 0xff800000ff800000;
    local_1dd8._0_8_ = 0xff800000ff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&lbbox_1,this,in_00,alloc);
      pBVar59[-10].lower = (float)lbbox_1.bounds0.lower.field_0._0_4_;
      pBVar59[-10].upper = (float)lbbox_1.bounds0.lower.field_0._4_4_;
      auVar30._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
      auVar30._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar59 + -8) = auVar30;
      pBVar59[-6].lower = (float)lbbox_1.bounds1.lower.field_0._0_4_;
      pBVar59[-6].upper = (float)lbbox_1.bounds1.lower.field_0._4_4_;
      pBVar59[-5].lower = (float)lbbox_1.bounds1.lower.field_0._8_4_;
      pBVar59[-5].upper = (float)lbbox_1.bounds1.lower.field_0._12_4_;
      pBVar59[-4].lower = (float)lbbox_1.bounds1.upper.field_0._0_4_;
      pBVar59[-4].upper = (float)lbbox_1.bounds1.upper.field_0._4_4_;
      pBVar59[-3].lower = (float)lbbox_1.bounds1.upper.field_0._8_4_;
      pBVar59[-3].upper = (float)lbbox_1.bounds1.upper.field_0._12_4_;
      pBVar59[-2].lower = (float)local_1bf8._0_4_;
      pBVar59[-2].upper = local_1bf8.m128[1];
      pBVar59[-1].lower = (float)local_1bf8._8_4_;
      pBVar59[-1].upper = local_1bf8.m128[3];
      *pBVar59 = local_1be8;
      local_1e18 = maxps(local_1e18,*(undefined1 (*) [16])(pBVar59 + -6));
      local_1dc8 = minps(local_1dc8,*(undefined1 (*) [16])(pBVar59 + -4));
      local_1df8 = minps(local_1df8,auVar30);
      local_1dd8 = maxps(local_1dd8,*(undefined1 (*) [16])(pBVar59 + -2));
      uVar58 = uVar58 + 1;
      pBVar59 = pBVar59 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar58 < local_848);
  }
  auVar29 = _DAT_01ff1820;
  auVar30 = _DAT_01ff1810;
  uVar48 = uVar48 | (ulong)pcVar54;
  if (((uint)uVar48 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar55 = (ulong)pcVar54 & 0xfffffffffffffff0;
      pfVar49 = &values[0].dt.upper;
      uVar58 = 0;
      do {
        *(undefined8 *)(uVar55 + uVar58 * 8) = *(undefined8 *)(pfVar49 + -0x15);
        fVar71 = ((BBox1f *)(pfVar49 + -1))->lower;
        fVar70 = 1.0 / (*pfVar49 - fVar71);
        fVar75 = -fVar71 * fVar70;
        fVar68 = 1.0 - fVar75;
        auVar67._0_4_ = pfVar49[-0x11] * fVar68 + pfVar49[-9] * fVar75;
        auVar67._4_4_ = pfVar49[-0x10] * fVar68 + pfVar49[-8] * fVar75;
        auVar67._8_4_ = pfVar49[-0xf] * fVar68 + pfVar49[-7] * fVar75;
        auVar67._12_4_ = pfVar49[-0xe] * fVar68 + pfVar49[-6] * fVar75;
        auVar69._0_4_ = fVar68 * pfVar49[-0xd] + fVar75 * pfVar49[-5];
        auVar69._4_4_ = fVar68 * pfVar49[-0xc] + fVar75 * pfVar49[-4];
        auVar69._8_4_ = fVar68 * pfVar49[-0xb] + fVar75 * pfVar49[-3];
        auVar69._12_4_ = fVar68 * pfVar49[-10] + fVar75 * pfVar49[-2];
        fVar70 = (1.0 - fVar71) * fVar70;
        fVar71 = 1.0 - fVar70;
        auVar66._0_4_ = pfVar49[-0x11] * fVar71 + pfVar49[-9] * fVar70;
        auVar66._4_4_ = pfVar49[-0x10] * fVar71 + pfVar49[-8] * fVar70;
        auVar66._8_4_ = pfVar49[-0xf] * fVar71 + pfVar49[-7] * fVar70;
        auVar66._12_4_ = pfVar49[-0xe] * fVar71 + pfVar49[-6] * fVar70;
        auVar72._0_4_ = fVar71 * pfVar49[-0xd] + fVar70 * pfVar49[-5];
        auVar72._4_4_ = fVar71 * pfVar49[-0xc] + fVar70 * pfVar49[-4];
        auVar72._8_4_ = fVar71 * pfVar49[-0xb] + fVar70 * pfVar49[-3];
        auVar72._12_4_ = fVar71 * pfVar49[-10] + fVar70 * pfVar49[-2];
        auVar67 = minps(auVar67,auVar29);
        auVar69 = maxps(auVar69,auVar30);
        auVar66 = minps(auVar66,auVar29);
        auVar72 = maxps(auVar72,auVar30);
        fVar71 = auVar67._0_4_ - ABS(auVar67._0_4_) * 4.7683716e-07;
        fVar68 = auVar67._4_4_ - ABS(auVar67._4_4_) * 4.7683716e-07;
        fVar70 = auVar67._8_4_ - ABS(auVar67._8_4_) * 4.7683716e-07;
        fVar75 = ABS(auVar69._0_4_) * 4.7683716e-07 + auVar69._0_4_;
        fVar73 = ABS(auVar69._4_4_) * 4.7683716e-07 + auVar69._4_4_;
        fVar74 = ABS(auVar69._8_4_) * 4.7683716e-07 + auVar69._8_4_;
        *(float *)(uVar55 + 0x20 + uVar58 * 4) = fVar71;
        *(float *)(uVar55 + 0x40 + uVar58 * 4) = fVar68;
        *(float *)(uVar55 + 0x60 + uVar58 * 4) = fVar70;
        *(float *)(uVar55 + 0x30 + uVar58 * 4) = fVar75;
        *(float *)(uVar55 + 0x50 + uVar58 * 4) = fVar73;
        *(float *)(uVar55 + 0x70 + uVar58 * 4) = fVar74;
        *(float *)(uVar55 + 0x80 + uVar58 * 4) =
             (auVar66._0_4_ - ABS(auVar66._0_4_) * 4.7683716e-07) - fVar71;
        *(float *)(uVar55 + 0xa0 + uVar58 * 4) =
             (auVar66._4_4_ - ABS(auVar66._4_4_) * 4.7683716e-07) - fVar68;
        *(float *)(uVar55 + 0xc0 + uVar58 * 4) =
             (auVar66._8_4_ - ABS(auVar66._8_4_) * 4.7683716e-07) - fVar70;
        *(float *)(uVar55 + 0x90 + uVar58 * 4) =
             (ABS(auVar72._0_4_) * 4.7683716e-07 + auVar72._0_4_) - fVar75;
        *(float *)(uVar55 + 0xb0 + uVar58 * 4) =
             (ABS(auVar72._4_4_) * 4.7683716e-07 + auVar72._4_4_) - fVar73;
        *(float *)(uVar55 + 0xd0 + uVar58 * 4) =
             (ABS(auVar72._8_4_) * 4.7683716e-07 + auVar72._8_4_) - fVar74;
        uVar58 = uVar58 + 1;
        pfVar49 = pfVar49 + 0x18;
      } while (local_848 != uVar58);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::Instance>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::Instance,embree::InstancePrimitive>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  uVar55 = uStack_1840;
  uVar58 = local_1848;
  if (bVar39) {
    vSplitPos.field_0.v[0] = (longlong)&local_18a8;
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    local_1b18 = (undefined1  [16])_DAT_01feb9f0;
    local_1b08 = (undefined1  [16])_DAT_01feba00;
    local_1af8 = (undefined1  [16])_DAT_01feb9f0;
    local_1ae8.m128 = _DAT_01feba00;
    uVar57 = uStack_1840 - local_1848;
    if (uVar57 < 0xc00) {
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           _DAT_01feb9f0;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 =
           _DAT_01feba00;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 =
           _DAT_01feb9f0;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 =
           _DAT_01feba00;
      aVar65 = _DAT_01feb9f0;
      aVar64 = _DAT_01feba00;
      aVar62 = _DAT_01feb9f0;
      aVar63 = _DAT_01feba00;
      if (local_1848 < uStack_1840) {
        lVar45 = local_1848 * 0x50 + 0xc;
        aVar62 = _DAT_01feb9f0;
        aVar63 = _DAT_01feba00;
        aVar64 = _DAT_01feba00;
        aVar65 = _DAT_01feb9f0;
        do {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_4_ = BStack_1820.lower;
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _4_4_ = BStack_1820.upper;
          pIVar14 = *(Instance **)
                     (*(long *)(*(long *)vSplitPos.field_0.v[1] + 0x1e8) +
                     (ulong)*(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).
                                             bounds0.lower.field_0 + lVar45) * 8);
          Instance::nonlinearBounds
                    (&lbbox_1,pIVar14,(BBox1f *)&right,&(pIVar14->super_Geometry).time_range,
                     (pIVar14->super_Geometry).fnumTimeSegments);
          auVar29._8_4_ = lbbox_1.bounds0.lower.field_0.m128[2];
          auVar29._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
          auVar29._12_2_ = lbbox_1.bounds0.lower.field_0._12_2_;
          auVar29._14_2_ = lbbox_1.bounds0.lower.field_0._14_2_;
          aVar65.m128 = (__m128)minps(aVar65.m128,auVar29);
          auVar31._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
          auVar31._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
          aVar64.m128 = (__m128)maxps(aVar64.m128,auVar31);
          auVar32._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
          auVar32._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
          aVar62.m128 = (__m128)minps(aVar62.m128,auVar32);
          auVar33._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
          auVar33._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
          aVar63.m128 = (__m128)maxps(aVar63.m128,auVar33);
          lVar45 = lVar45 + 0x50;
          uVar57 = uVar57 - 1;
        } while (uVar57 != 0);
      }
    }
    else {
      lbbox_1.bounds0.lower.field_0._12_2_ = 0x401;
      lbbox_1.bounds1.lower.field_0._0_8_ = 0;
      lbbox_1.bounds1.lower.field_0._8_8_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&lbbox_1);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar55;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar58;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)local_1b18,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&lbbox_1,in_stack_ffffffffffffe1d8);
      cVar44 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&lbbox_1);
      if (cVar44 != '\0') {
        prVar52 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar52,"task cancelled");
        __cxa_throw(prVar52,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&lbbox_1);
      aVar65 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      aVar64 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0;
      aVar62 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0;
      aVar63 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0;
    }
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 = aVar63;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 = aVar62;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 = aVar64;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 = aVar65;
    (__return_storage_ptr__->ref).ptr = uVar48;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    local_1dd8._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    local_1dd8._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_;
  }
  else {
    (__return_storage_ptr__->ref).ptr = uVar48;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1df8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e18._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1dc8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1dc8._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dd8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1dd8._8_8_;
  __return_storage_ptr__->dt = BStack_1820;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar48 = 0;
  do {
    pBVar15 = local_8c8[uVar48];
    pBVar59 = pBVar15 + 1;
    *pBVar59 = (BBox1f)((long)*pBVar59 + -1);
    if ((*pBVar59 == (BBox1f)0x0) && (BVar7 = *pBVar15, BVar7 != (BBox1f)0x0)) {
      lVar45 = *(undefined8 *)((long)BVar7 + 0x18);
      pvVar47 = *(void **)((long)BVar7 + 0x20);
      if (pvVar47 != (void *)0x0) {
        if ((ulong)(lVar45 * 0x50) < 0x1c00000) {
          alignedFree(pvVar47);
        }
        else {
          os_free(pvVar47,lVar45 * 0x50,*(bool *)((long)BVar7 + 8));
        }
      }
      if (lVar45 != 0) {
        (**(code **)**(undefined8 **)BVar7)(*(undefined8 **)BVar7,lVar45 * -0x50,1);
      }
      *(undefined8 *)((long)BVar7 + 0x10) = 0;
      *(undefined8 *)((long)BVar7 + 0x18) = 0;
      *(undefined8 *)((long)BVar7 + 0x20) = 0;
      operator_delete((void *)BVar7);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }